

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iostream-test.c++
# Opt level: O1

void __thiscall kj::std::anon_unknown_0::TestCase64::run(TestCase64 *this)

{
  DebugExpression<bool> _kjCondition;
  StdInputStream in;
  StdOutputStream out;
  byte buf [8];
  Fault f;
  Maybe<kj::Exception> e;
  stringstream ss;
  char local_1a0 [376];
  
  ::std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  in.super_InputStream._vptr_InputStream = (_func_int **)&PTR__BufferedInputStream_00238f50;
  in.stream_ = (istream *)&ss;
  ::std::ostream::write(local_1a0,0x1ede90);
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  InputStream::read(&in.super_InputStream,(int)buf,&DAT_00000008,8);
  __kjCondition = __kjCondition & 0xffffffffffffff00;
  _::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/std/iostream-test.c++"
             ,0x51,FAILED,"!(e == kj::none)","_kjCondition,",&_kjCondition);
  _::Debug::Fault::fatal(&f);
}

Assistant:

TEST(StdIoStream, ReadToEndOfFile) {
  // Check that read throws an exception when eof is reached before specified
  // bytes.

  ::std::stringstream ss;

  StdInputStream in(ss);
  StdOutputStream out(ss);

  out.write("foobar"_kjb);

  byte buf[8]{};

  Maybe<Exception> e = kj::runCatchingExceptions([&]() {
    in.read(buf);
  });

  ASSERT_FALSE(e == kj::none);

  // Ensure that the value is still read up to the EOF.
  EXPECT_EQ("foobar"_kjb, arrayPtr(buf).first(6));
}